

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O0

void __thiscall
hdc::TACBuilderVisitor::visit(TACBuilderVisitor *this,LiteralIntegerExpression *expression)

{
  int tmp;
  string *psVar1;
  string local_a8 [48];
  Token local_78;
  undefined1 local_48 [8];
  Token token;
  LiteralIntegerExpression *expression_local;
  TACBuilderVisitor *this_local;
  
  token._40_8_ = expression;
  Token::Token((Token *)local_48);
  LiteralExpression::get_token(&local_78,(LiteralExpression *)token._40_8_);
  Token::operator=((Token *)local_48,&local_78);
  Token::~Token(&local_78);
  tmp = newTemporary(this);
  psVar1 = Token::getLexem_abi_cxx11_((Token *)local_48);
  std::__cxx11::string::string(local_a8,(string *)psVar1);
  emit(this,TAC_CONST_I32,tmp,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  Token::~Token((Token *)local_48);
  return;
}

Assistant:

void TACBuilderVisitor::visit(LiteralIntegerExpression* expression) {
    Token token;

    token = expression->get_token();
    emit(TAC_CONST_I32, newTemporary(), token.getLexem());
}